

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O0

int Abc_FlowRetime_PushFlows(Abc_Ntk_t *pNtk,int fVerbose)

{
  Flow_Data_t *pFVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  uint local_5c;
  Abc_Obj_t *pObj2;
  Abc_Obj_t *pObj;
  int srcDist;
  int last;
  int flow;
  int j;
  int i;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  srcDist = 0;
  pObj._0_4_ = 0;
  pManMR->constraintMask = pManMR->constraintMask | 0x10;
  pManMR->fSinkDistTerminate = 0;
  dfsfast_preorder(pNtk);
  while (pManMR->fSinkDistTerminate == 0 && (uint)pObj < 30000) {
    pObj._0_4_ = 30000;
    for (flow = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), flow < iVar2; flow = flow + 1) {
      pAVar5 = Abc_NtkBox(pNtk,flow);
      iVar2 = Abc_ObjIsLatch(pAVar5);
      if ((iVar2 != 0) &&
         (pFVar1 = pManMR->pDataArray, uVar4 = Abc_ObjId(pAVar5),
         (*(uint *)&pFVar1[uVar4].field_0x10 & 0xffff) != 0)) {
        pFVar1 = pManMR->pDataArray;
        uVar4 = Abc_ObjId(pAVar5);
        if ((uint)pObj < (*(uint *)&pFVar1[uVar4].field_0x10 & 0xffff)) {
          local_5c = (uint)pObj;
        }
        else {
          pFVar1 = pManMR->pDataArray;
          uVar4 = Abc_ObjId(pAVar5);
          local_5c = *(uint *)&pFVar1[uVar4].field_0x10 & 0xffff;
        }
        pObj._0_4_ = local_5c;
      }
    }
    for (flow = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), flow < iVar2; flow = flow + 1) {
      pAVar5 = Abc_NtkBox(pNtk,flow);
      iVar2 = Abc_ObjIsLatch(pAVar5);
      if (((iVar2 != 0) &&
          (pFVar1 = pManMR->pDataArray, uVar4 = Abc_ObjId(pAVar5),
          (uint)pObj == (*(uint *)&pFVar1[uVar4].field_0x10 & 0xffff))) &&
         (iVar2 = dfsfast_e(pAVar5,(Abc_Obj_t *)0x0), iVar2 != 0)) {
        srcDist = srcDist + 1;
      }
    }
  }
  if ((fVerbose != 0) && (pManMR->fVerbose != 0)) {
    printf("\t\tmax-flow1 = %d \t",(ulong)(uint)srcDist);
  }
  do {
    iVar2 = srcDist;
    for (flow = 0; iVar3 = Vec_PtrSize(pNtk->vBoxes), flow < iVar3; flow = flow + 1) {
      pAVar5 = Abc_NtkBox(pNtk,flow);
      iVar3 = Abc_ObjIsLatch(pAVar5);
      if ((iVar3 != 0) && (iVar3 = dfsplain_e(pAVar5,(Abc_Obj_t *)0x0), iVar3 != 0)) {
        srcDist = srcDist + 1;
        for (last = 0; iVar3 = Vec_PtrSize(pNtk->vObjs), last < iVar3; last = last + 1) {
          pAVar5 = Abc_NtkObj(pNtk,last);
          if (pAVar5 != (Abc_Obj_t *)0x0) {
            pFVar1 = pManMR->pDataArray;
            uVar4 = Abc_ObjId(pAVar5);
            *(ushort *)(pFVar1 + uVar4) = *(ushort *)(pFVar1 + uVar4) & 0xfffc;
          }
        }
      }
    }
  } while (iVar2 < srcDist);
  if ((fVerbose != 0) && (pManMR->fVerbose != 0)) {
    printf("max-flow2 = %d\n",(ulong)(uint)srcDist);
  }
  return srcDist;
}

Assistant:

int
Abc_FlowRetime_PushFlows( Abc_Ntk_t * pNtk, int fVerbose ) {
  int i, j, flow = 0, last, srcDist = 0;
  Abc_Obj_t   *pObj, *pObj2;
//  int clk = clock();

  pManMR->constraintMask |= BLOCK;

  pManMR->fSinkDistTerminate = 0;
  dfsfast_preorder( pNtk );

  // (i) fast max-flow computation
  while(!pManMR->fSinkDistTerminate && srcDist < MAX_DIST) {
    srcDist = MAX_DIST;
    Abc_NtkForEachLatch( pNtk, pObj, i )
      if (FDATA(pObj)->e_dist)    
        srcDist = MIN(srcDist, (int)FDATA(pObj)->e_dist);
    
    Abc_NtkForEachLatch( pNtk, pObj, i ) {
      if (srcDist == (int)FDATA(pObj)->e_dist &&
          dfsfast_e( pObj, NULL )) {
#ifdef DEBUG_PRINT_FLOWS
        printf("\n\n");
#endif
        flow++;
      }
    }
  }

  if (fVerbose) vprintf("\t\tmax-flow1 = %d \t", flow);

  // (ii) complete max-flow computation
  // also, marks source-reachable nodes
  do {
    last = flow;
    Abc_NtkForEachLatch( pNtk, pObj, i ) {
      if (dfsplain_e( pObj, NULL )) {
#ifdef DEBUG_PRINT_FLOWS
        printf("\n\n");
#endif
        flow++;
        Abc_NtkForEachObj( pNtk, pObj2, j )
          FUNSET( pObj2, VISITED );
      }
    }
  } while (flow > last);
  
  if (fVerbose) vprintf("max-flow2 = %d\n", flow);

//  PRT( "time", clock() - clk );
  return flow;
}